

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_generate_luts.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  uint uVar5;
  int orient;
  int iVar6;
  long lVar7;
  uint uVar8;
  undefined8 uVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar14 [16];
  double dVar13;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar19;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar17 [16];
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar18 [16];
  double dVar20;
  undefined1 auVar21 [16];
  uint uVar24;
  double dVar26;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar28;
  double dVar30;
  undefined1 auVar29 [16];
  double dVar31;
  undefined1 auVar33 [16];
  double dVar32;
  double dVar36;
  double dVar37;
  undefined1 auVar34 [16];
  double dVar38;
  double dVar39;
  int lut_nmsedec_ref0 [128];
  int lut_nmsedec_ref [128];
  int lut_nmsedec_sig0 [128];
  int lut_nmsedec_sig [128];
  int lut_ctxno_zc [1024];
  undefined4 uStack_18f4;
  undefined4 uStack_18f0;
  undefined4 uStack_18ec;
  undefined4 uStack_18d4;
  undefined4 uStack_18d0;
  undefined4 uStack_18cc;
  undefined4 uStack_18b4;
  undefined4 uStack_18b0;
  undefined4 uStack_18ac;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  int local_1838;
  uint local_1828 [1535];
  uint local_2c;
  uint uVar25;
  int iVar27;
  int iVar35;
  
  puts("/* This file was automatically generated by t1_generate_luts.c */\n");
  iVar6 = 0;
  do {
    uVar10 = iVar6 << 8;
    if (iVar6 == 1) {
      uVar10 = 0x200;
    }
    if (iVar6 == 2) {
      uVar10 = 0x100;
    }
    uVar8 = 0;
    do {
      uVar5 = t1_init_ctxno_zc(uVar8,iVar6);
      local_1828[(ulong)(uVar10 | uVar8) + 0x200] = uVar5;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 0x100);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 4);
  printf("static OPJ_BYTE lut_ctxno_zc[1024] = {\n  ");
  uVar11 = 1;
  do {
    printf("%i, ",(ulong)local_1828[uVar11 + 0x1ff]);
    if ((uVar11 & 0x1f) == 0) {
      printf("\n  ");
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x400);
  printf("%i\n};\n\n",(ulong)local_2c);
  printf("static OPJ_BYTE lut_ctxno_sc[256] = {\n  ");
  uVar10 = 1;
  iVar6 = 0;
  do {
    uVar8 = t1_init_ctxno_sc(iVar6);
    printf("0x%x, ",(ulong)uVar8);
    if ((uVar10 & 0xf) == 0) {
      printf("\n  ");
    }
    uVar10 = uVar10 + 1;
    iVar6 = iVar6 + 0x10;
  } while (uVar10 != 0x100);
  printf("0x%x\n};\n\n",0xd);
  printf("static OPJ_BYTE lut_spb[256] = {\n  ");
  uVar10 = 1;
  iVar6 = 0;
  do {
    uVar8 = t1_init_spb(iVar6);
    printf("%i, ",(ulong)uVar8);
    if ((uVar10 & 0x1f) == 0) {
      printf("\n  ");
    }
    uVar10 = uVar10 + 1;
    iVar6 = iVar6 + 0x10;
  } while (uVar10 != 0x100);
  lVar7 = 0;
  uVar9 = 1;
  printf("%i\n};\n\n");
  local_1898 = 2;
  uStack_1890 = 3;
  local_18a8 = 0;
  uStack_18a0 = 1;
  auVar23 = _DAT_00102030;
  do {
    iVar35 = auVar23._4_4_;
    auVar33._0_8_ = auVar23._0_8_ & 0xffffffff;
    auVar33._8_4_ = iVar35;
    auVar33._12_4_ = 0;
    uVar25 = auVar23._8_4_;
    auVar21._4_4_ = 0;
    auVar21._0_4_ = uVar25;
    iVar27 = auVar23._12_4_;
    auVar21._8_4_ = iVar27;
    auVar21._12_4_ = 0;
    dVar20 = (SUB168(auVar21 | _DAT_00102040,0) - (double)DAT_00102040) * 0.015625;
    dVar26 = (SUB168(auVar21 | _DAT_00102040,8) - DAT_00102040._8_8_) * 0.015625;
    dVar31 = (SUB168(auVar33 | _DAT_00102040,0) - (double)DAT_00102040) * 0.015625;
    dVar36 = (SUB168(auVar33 | _DAT_00102040,8) - DAT_00102040._8_8_) * 0.015625;
    dVar32 = dVar31 + -1.5;
    dVar37 = dVar36 + -1.5;
    dVar28 = dVar20 + -1.5;
    dVar30 = dVar26 + -1.5;
    dVar38 = (dVar31 * dVar31 - dVar32 * dVar32) * 64.0 + 0.5;
    dVar39 = (dVar36 * dVar36 - dVar37 * dVar37) * 64.0 + 0.5;
    dVar12 = floor(dVar38);
    uStack_18b4 = (undefined4)((ulong)dVar38 >> 0x20);
    uStack_18b0 = SUB84(dVar39,0);
    uStack_18ac = (undefined4)((ulong)dVar39 >> 0x20);
    auVar1._4_8_ = extraout_XMM0_Qb;
    auVar1._0_4_ = uStack_18b4;
    auVar14._0_8_ = auVar1._0_8_ << 0x20;
    auVar14._8_4_ = uStack_18b0;
    auVar14._12_4_ = uStack_18ac;
    dVar38 = floor(auVar14._8_8_);
    dVar39 = floor((dVar20 * dVar20 - dVar28 * dVar28) * 64.0 + 0.5);
    dVar13 = floor((dVar26 * dVar26 - dVar30 * dVar30) * 64.0 + 0.5);
    uVar10 = (uint)(dVar39 * 0.015625 * 8192.0);
    uVar8 = (uint)(dVar13 * 0.015625 * 8192.0);
    uVar5 = (uint)(dVar12 * 0.015625 * 8192.0);
    uVar24 = (uint)(dVar38 * 0.015625 * 8192.0);
    local_1828[lVar7 + 0x180] = -(uint)(0 < (int)uVar5) & uVar5;
    local_1828[lVar7 + 0x181] = -(uint)(0 < (int)uVar24) & uVar24;
    local_1828[lVar7 + 0x182] = -(uint)(0 < (int)uVar10) & uVar10;
    local_1828[lVar7 + 0x183] = -(uint)(0 < (int)uVar8) & uVar8;
    dVar12 = dVar31 * dVar31 * 64.0 + 0.5;
    dVar39 = dVar36 * dVar36 * 64.0 + 0.5;
    dVar38 = floor(dVar12);
    uStack_18f4 = (undefined4)((ulong)dVar12 >> 0x20);
    uStack_18f0 = SUB84(dVar39,0);
    uStack_18ec = (undefined4)((ulong)dVar39 >> 0x20);
    auVar2._4_8_ = extraout_XMM0_Qb_00;
    auVar2._0_4_ = uStack_18f4;
    auVar15._0_8_ = auVar2._0_8_ << 0x20;
    auVar15._8_4_ = uStack_18f0;
    auVar15._12_4_ = uStack_18ec;
    dVar12 = floor(auVar15._8_8_);
    dVar39 = floor(dVar20 * dVar20 * 64.0 + 0.5);
    dVar13 = floor(dVar26 * dVar26 * 64.0 + 0.5);
    uVar10 = (uint)(dVar39 * 0.015625 * 8192.0);
    uVar8 = (uint)(dVar13 * 0.015625 * 8192.0);
    uVar5 = (uint)(dVar38 * 0.015625 * 8192.0);
    uVar24 = (uint)(dVar12 * 0.015625 * 8192.0);
    local_1828[lVar7 + 0x100] = -(uint)(0 < (int)uVar5) & uVar5;
    local_1828[lVar7 + 0x101] = -(uint)(0 < (int)uVar24) & uVar24;
    local_1828[lVar7 + 0x102] = -(uint)(0 < (int)uVar10) & uVar10;
    local_1828[lVar7 + 0x103] = -(uint)(0 < (int)uVar8) & uVar8;
    auVar29._0_4_ = -(uint)((int)((uint)local_1898 ^ 0x80000000) < -0x7fffffc0);
    auVar29._4_4_ = -(uint)((int)((uint)local_1898 ^ 0x80000000) < -0x7fffffc0);
    auVar29._8_4_ = -(uint)((int)((uint)uStack_1890 ^ 0x80000000) < -0x7fffffc0);
    auVar29._12_4_ = -(uint)((int)((uint)uStack_1890 ^ 0x80000000) < -0x7fffffc0);
    auVar16._0_4_ = -(uint)((local_1898._4_4_ ^ 0x80000000) == 0x80000000);
    auVar16._4_4_ = -(uint)((local_1898._4_4_ ^ 0x80000000) == 0x80000000);
    auVar16._8_4_ = -(uint)((uStack_1890._4_4_ ^ 0x80000000) == 0x80000000);
    auVar16._12_4_ = -(uint)((uStack_1890._4_4_ ^ 0x80000000) == 0x80000000);
    auVar34._0_4_ = -(uint)((int)((uint)local_18a8 ^ 0x80000000) < -0x7fffffc0);
    auVar34._4_4_ = -(uint)((int)((uint)local_18a8 ^ 0x80000000) < -0x7fffffc0);
    auVar34._8_4_ = -(uint)((int)((uint)uStack_18a0 ^ 0x80000000) < -0x7fffffc0);
    auVar34._12_4_ = -(uint)((int)((uint)uStack_18a0 ^ 0x80000000) < -0x7fffffc0);
    auVar22._0_4_ = -(uint)((local_18a8._4_4_ ^ 0x80000000) == 0x80000000);
    auVar22._4_4_ = -(uint)((local_18a8._4_4_ ^ 0x80000000) == 0x80000000);
    auVar22._8_4_ = -(uint)((uStack_18a0._4_4_ ^ 0x80000000) == 0x80000000);
    auVar22._12_4_ = -(uint)((uStack_18a0._4_4_ ^ 0x80000000) == 0x80000000);
    uVar11 = SUB168(auVar22 & auVar34,0);
    uVar19 = SUB168(auVar22 & auVar34,8);
    dVar38 = (double)(~uVar11 & (ulong)dVar32 | (ulong)(dVar31 + -0.5) & uVar11);
    dVar39 = (double)(~uVar19 & (ulong)dVar37 | (ulong)(dVar36 + -0.5) & uVar19);
    uVar11 = SUB168(auVar16 & auVar29,0);
    uVar19 = SUB168(auVar16 & auVar29,8);
    dVar12 = (double)(~uVar11 & (ulong)dVar28 | (ulong)(dVar20 + -0.5) & uVar11);
    dVar13 = (double)(~uVar19 & (ulong)dVar30 | (ulong)(dVar26 + -0.5) & uVar19);
    dVar28 = (dVar31 + -1.0) * (dVar31 + -1.0);
    dVar31 = (dVar36 + -1.0) * (dVar36 + -1.0);
    dVar20 = (dVar20 + -1.0) * (dVar20 + -1.0);
    dVar26 = (dVar26 + -1.0) * (dVar26 + -1.0);
    dVar30 = (dVar28 - dVar38 * dVar38) * 64.0 + 0.5;
    dVar39 = (dVar31 - dVar39 * dVar39) * 64.0 + 0.5;
    dVar38 = floor(dVar30);
    uStack_18d4 = (undefined4)((ulong)dVar30 >> 0x20);
    uStack_18d0 = SUB84(dVar39,0);
    uStack_18cc = (undefined4)((ulong)dVar39 >> 0x20);
    auVar3._4_8_ = extraout_XMM0_Qb_01;
    auVar3._0_4_ = uStack_18d4;
    auVar17._0_8_ = auVar3._0_8_ << 0x20;
    auVar17._8_4_ = uStack_18d0;
    auVar17._12_4_ = uStack_18cc;
    dVar39 = floor(auVar17._8_8_);
    dVar12 = floor((dVar20 - dVar12 * dVar12) * 64.0 + 0.5);
    dVar13 = floor((dVar26 - dVar13 * dVar13) * 64.0 + 0.5);
    uVar10 = (uint)(dVar12 * 0.015625 * 8192.0);
    uVar8 = (uint)(dVar13 * 0.015625 * 8192.0);
    uVar5 = (uint)(dVar38 * 0.015625 * 8192.0);
    uVar24 = (uint)(dVar39 * 0.015625 * 8192.0);
    local_1828[lVar7 + 0x80] = -(uint)(0 < (int)uVar5) & uVar5;
    local_1828[lVar7 + 0x81] = -(uint)(0 < (int)uVar24) & uVar24;
    local_1828[lVar7 + 0x82] = -(uint)(0 < (int)uVar10) & uVar10;
    local_1828[lVar7 + 0x83] = -(uint)(0 < (int)uVar8) & uVar8;
    dVar12 = dVar28 * 64.0 + 0.5;
    dVar39 = dVar31 * 64.0 + 0.5;
    dVar38 = floor(dVar12);
    uStack_18f4 = (undefined4)((ulong)dVar12 >> 0x20);
    uStack_18f0 = SUB84(dVar39,0);
    uStack_18ec = (undefined4)((ulong)dVar39 >> 0x20);
    auVar4._4_8_ = extraout_XMM0_Qb_02;
    auVar4._0_4_ = uStack_18f4;
    auVar18._0_8_ = auVar4._0_8_ << 0x20;
    auVar18._8_4_ = uStack_18f0;
    auVar18._12_4_ = uStack_18ec;
    dVar12 = floor(auVar18._8_8_);
    dVar39 = floor(dVar20 * 64.0 + 0.5);
    dVar13 = floor(dVar26 * 64.0 + 0.5);
    iVar6 = (int)uVar9;
    uVar10 = (uint)(dVar39 * 0.015625 * 8192.0);
    uVar8 = (uint)(dVar13 * 0.015625 * 8192.0);
    uVar5 = (uint)(dVar38 * 0.015625 * 8192.0);
    uVar24 = (uint)(dVar12 * 0.015625 * 8192.0);
    local_1838 = auVar23._0_4_;
    local_1828[lVar7] = -(uint)(0 < (int)uVar5) & uVar5;
    local_1828[lVar7 + 1] = -(uint)(0 < (int)uVar24) & uVar24;
    local_1828[lVar7 + 2] = -(uint)(0 < (int)uVar10) & uVar10;
    local_1828[lVar7 + 3] = -(uint)(0 < (int)uVar8) & uVar8;
    lVar7 = lVar7 + 4;
    local_18a8 = local_18a8 + 4;
    uStack_18a0 = uStack_18a0 + 4;
    local_1898 = local_1898 + 4;
    uStack_1890 = uStack_1890 + 4;
    auVar23._0_4_ = local_1838 + 4;
    auVar23._4_4_ = iVar35 + 4;
    auVar23._8_4_ = uVar25 + 4;
    auVar23._12_4_ = iVar27 + 4;
  } while (lVar7 != 0x80);
  printf("static OPJ_INT16 lut_nmsedec_sig[1 << T1_NMSEDEC_BITS] = {\n  ");
  dump_array16((int *)(local_1828 + 0x180),iVar6);
  printf("static OPJ_INT16 lut_nmsedec_sig0[1 << T1_NMSEDEC_BITS] = {\n  ");
  dump_array16((int *)(local_1828 + 0x100),iVar6);
  printf("static OPJ_INT16 lut_nmsedec_ref[1 << T1_NMSEDEC_BITS] = {\n  ");
  dump_array16((int *)(local_1828 + 0x80),iVar6);
  printf("static OPJ_INT16 lut_nmsedec_ref0[1 << T1_NMSEDEC_BITS] = {\n  ");
  dump_array16((int *)local_1828,iVar6);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	int i, j;
	double u, v, t;

	int lut_ctxno_zc[1024];
	int lut_nmsedec_sig[1 << T1_NMSEDEC_BITS];
	int lut_nmsedec_sig0[1 << T1_NMSEDEC_BITS];
	int lut_nmsedec_ref[1 << T1_NMSEDEC_BITS];
	int lut_nmsedec_ref0[1 << T1_NMSEDEC_BITS];
  (void)argc; (void)argv;

	printf("/* This file was automatically generated by t1_generate_luts.c */\n\n");

	/* lut_ctxno_zc */
	for (j = 0; j < 4; ++j) {
		for (i = 0; i < 256; ++i) {
			int orient = j;
			if (orient == 2) {
				orient = 1;
			} else if (orient == 1) {
				orient = 2;
			}
			lut_ctxno_zc[(orient << 8) | i] = t1_init_ctxno_zc(i, j);
		}
	}

	printf("static OPJ_BYTE lut_ctxno_zc[1024] = {\n  ");
	for (i = 0; i < 1023; ++i) {
		printf("%i, ", lut_ctxno_zc[i]);
		if(!((i+1)&0x1f))
			printf("\n  ");
	}
	printf("%i\n};\n\n", lut_ctxno_zc[1023]);

	/* lut_ctxno_sc */
	printf("static OPJ_BYTE lut_ctxno_sc[256] = {\n  ");
	for (i = 0; i < 255; ++i) {
		printf("0x%x, ", t1_init_ctxno_sc(i << 4));
		if(!((i+1)&0xf))
			printf("\n  ");
	}
	printf("0x%x\n};\n\n", t1_init_ctxno_sc(255 << 4));

	/* lut_spb */
	printf("static OPJ_BYTE lut_spb[256] = {\n  ");
	for (i = 0; i < 255; ++i) {
		printf("%i, ", t1_init_spb(i << 4));
		if(!((i+1)&0x1f))
			printf("\n  ");
	}
	printf("%i\n};\n\n", t1_init_spb(255 << 4));

	/* FIXME FIXME FIXME */
	/* fprintf(stdout,"nmsedec luts:\n"); */
	for (i = 0; i < (1 << T1_NMSEDEC_BITS); ++i) {
		t = i / pow(2, T1_NMSEDEC_FRACBITS);
		u = t;
		v = t - 1.5;
		lut_nmsedec_sig[i] = 
			opj_int_max(0, 
					(int) (floor((u * u - v * v) * pow(2, T1_NMSEDEC_FRACBITS) + 0.5) / pow(2, T1_NMSEDEC_FRACBITS) * 8192.0));
		lut_nmsedec_sig0[i] =
			opj_int_max(0,
					(int) (floor((u * u) * pow(2, T1_NMSEDEC_FRACBITS) + 0.5) / pow(2, T1_NMSEDEC_FRACBITS) * 8192.0));
		u = t - 1.0;
		if (i & (1 << (T1_NMSEDEC_BITS - 1))) {
			v = t - 1.5;
		} else {
			v = t - 0.5;
		}
		lut_nmsedec_ref[i] =
			opj_int_max(0,
					(int) (floor((u * u - v * v) * pow(2, T1_NMSEDEC_FRACBITS) + 0.5) / pow(2, T1_NMSEDEC_FRACBITS) * 8192.0));
		lut_nmsedec_ref0[i] =
			opj_int_max(0,
					(int) (floor((u * u) * pow(2, T1_NMSEDEC_FRACBITS) + 0.5) / pow(2, T1_NMSEDEC_FRACBITS) * 8192.0));
	}

	printf("static OPJ_INT16 lut_nmsedec_sig[1 << T1_NMSEDEC_BITS] = {\n  ");
	dump_array16(lut_nmsedec_sig, 1 << T1_NMSEDEC_BITS);

	printf("static OPJ_INT16 lut_nmsedec_sig0[1 << T1_NMSEDEC_BITS] = {\n  ");
	dump_array16(lut_nmsedec_sig0, 1 << T1_NMSEDEC_BITS);

	printf("static OPJ_INT16 lut_nmsedec_ref[1 << T1_NMSEDEC_BITS] = {\n  ");
	dump_array16(lut_nmsedec_ref, 1 << T1_NMSEDEC_BITS);

	printf("static OPJ_INT16 lut_nmsedec_ref0[1 << T1_NMSEDEC_BITS] = {\n  ");
	dump_array16(lut_nmsedec_ref0, 1 << T1_NMSEDEC_BITS);

	return 0;
}